

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.h
# Opt level: O0

long bloaty::dwarf::ReadLEB128<long>(string_view *data)

{
  char *pcVar1;
  long lVar2;
  Int64Type val;
  char *pcVar3;
  char *str;
  
  pcVar1 = (char *)ReadLEB128Internal(data._7_1_,(string_view *)val);
  pcVar3 = pcVar1;
  lVar2 = std::numeric_limits<long>::max();
  str = pcVar3;
  if ((long)pcVar1 <= lVar2) {
    lVar2 = std::numeric_limits<long>::min();
    if (lVar2 <= (long)pcVar3) {
      return (long)str;
    }
  }
  Throw(str,(int)((ulong)pcVar1 >> 0x20));
}

Assistant:

T ReadLEB128(std::string_view* data) {
  typedef typename std::conditional<std::is_signed<T>::value, int64_t,
                                    uint64_t>::type Int64Type;
  Int64Type val = ReadLEB128Internal(std::is_signed<T>::value, data);
  if (val > std::numeric_limits<T>::max() ||
      val < std::numeric_limits<T>::min()) {
    THROW("DWARF data contained larger LEB128 than we were expecting");
  }
  return static_cast<T>(val);
}